

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QPermission *permission)

{
  int iVar1;
  PermissionStatus PVar2;
  QDebug *this;
  QMetaType QVar3;
  QPermission *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  int verbosity;
  QDebugStateSaver saver;
  QPermission *in_stack_ffffffffffffff58;
  QDebugStateSaver *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  QDebug *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff78;
  QDebugStateSaver *in_stack_ffffffffffffff80;
  PermissionStatus value;
  Stream *this_00;
  QDebug *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  QDebug local_28 [2];
  QMetaType local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  iVar1 = QDebug::verbosity(in_RSI);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  value = (PermissionStatus)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  this = QDebug::nospace(in_RSI);
  QDebug::setVerbosity(this,0);
  if (1 < iVar1) {
    QVar3 = QPermission::type(in_stack_ffffffffffffff58);
    local_18 = QVar3;
    QMetaType::name(&local_18);
    value = (PermissionStatus)((ulong)QVar3.d_ptr >> 0x20);
    in_stack_ffffffffffffff70 =
         QDebug::operator<<((QDebug *)this_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8));
    QDebug::operator<<((QDebug *)this_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8));
  }
  QDebug::QDebug(local_28,in_RSI);
  PVar2 = QPermission::status(in_RDX);
  operator<<((QDebug *)this_00,value);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  if (1 < iVar1) {
    QDebug::operator<<((QDebug *)this_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8));
  }
  QDebug::QDebug(in_stack_ffffffffffffff70,(QDebug *)CONCAT44(PVar2,in_stack_ffffffffffffff68));
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QPermission &permission)
{
    const auto verbosity = debug.verbosity();
    QDebugStateSaver saver(debug);
    debug.nospace().setVerbosity(0);
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << permission.type().name() << "(";
    debug << permission.status();
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << ")";
    return debug;
}